

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_58::Register(anon_unknown_58 *this,ExtensionInfo *info)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  undefined8 *puVar3;
  ctrl_t *pcVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ushort uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *this_00;
  char cVar18;
  bool bVar19;
  int iVar20;
  undefined8 uVar21;
  LogMessage *this_01;
  long lVar22;
  undefined1 uVar23;
  uint uVar24;
  ulong uVar25;
  ExtensionInfo *pEVar26;
  uint64_t v;
  const_iterator *b;
  const_iterator *a;
  ushort uVar27;
  long lVar28;
  uintptr_t v_2;
  ulong uVar29;
  uint64_t v_5;
  uint uVar30;
  ulong uVar31;
  __m128i match;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  FindInfo FVar42;
  LogMessageFatal local_68 [20];
  undefined4 local_54;
  GetTypeNameReturnType local_50;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  
  if (((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
       local_static_registry == '\0') &&
     (iVar20 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    Register(google::protobuf::internal::ExtensionInfo_const&)::
                                    local_static_registry), iVar20 != 0)) {
    pEVar26 = (ExtensionInfo *)operator_new(0x20);
    pEVar26->message = (MessageLite *)0x0;
    pEVar26->number = 0;
    pEVar26->type = '\0';
    pEVar26->is_repeated = false;
    pEVar26->is_packed = false;
    pEVar26->is_lazy = kUndefined;
    (pEVar26->field_6).enum_validity_check.func =
         absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    info = pEVar26;
    OnShutdownRun(OnShutdownDelete<absl::lts_20240722::flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                  ::anon_class_1_0_00000001::__invoke,pEVar26);
    Register::local_static_registry =
         (flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          *)pEVar26;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::internal::ExtensionInfo_const&)::
                         local_static_registry);
  }
  this_00 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertHashEqConsistent<google::protobuf::internal::ExtensionInfo>
            (&Register::local_static_registry->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,info);
  pcVar4 = (this_00->
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  lVar22 = *(long *)this;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + lVar22;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),8)) + lVar22;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
       SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)*(uint *)(this + 8);
  uVar5 = (this_00->
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar5 + 1 & uVar5) == 0) {
    pEVar26 = (ExtensionInfo *)
              (SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),8) ^
              SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),0));
    uVar31 = (ulong)pEVar26 >> 7 ^ (ulong)pcVar4 >> 0xc;
    auVar32 = ZEXT216(CONCAT11((char)pEVar26,(char)pEVar26) & 0x7f7f);
    auVar32 = pshuflw(auVar32,auVar32,0);
    lVar6 = *(long *)((long)&(this_00->
                             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                             ).settings_.
                             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_ + 8);
    uVar29 = 0;
    while( true ) {
      uVar31 = uVar31 & uVar5;
      pcVar1 = pcVar4 + uVar31;
      cVar35 = auVar32[0];
      auVar37[0] = -(cVar35 == *pcVar1);
      cVar36 = auVar32[1];
      auVar37[1] = -(cVar36 == pcVar1[1]);
      cVar39 = auVar32[2];
      auVar37[2] = -(cVar39 == pcVar1[2]);
      cVar40 = auVar32[3];
      auVar37[3] = -(cVar40 == pcVar1[3]);
      auVar37[4] = -(cVar35 == pcVar1[4]);
      auVar37[5] = -(cVar36 == pcVar1[5]);
      auVar37[6] = -(cVar39 == pcVar1[6]);
      auVar37[7] = -(cVar40 == pcVar1[7]);
      auVar37[8] = -(cVar35 == pcVar1[8]);
      auVar37[9] = -(cVar36 == pcVar1[9]);
      auVar37[10] = -(cVar39 == pcVar1[10]);
      auVar37[0xb] = -(cVar40 == pcVar1[0xb]);
      auVar37[0xc] = -(cVar35 == pcVar1[0xc]);
      auVar37[0xd] = -(cVar36 == pcVar1[0xd]);
      auVar37[0xe] = -(cVar39 == pcVar1[0xe]);
      auVar37[0xf] = -(cVar40 == pcVar1[0xf]);
      uVar27 = (ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe | (ushort)(auVar37[0xf] >> 7) << 0xf;
      uVar24 = (uint)uVar27;
      while (uVar27 != 0) {
        uVar30 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        lVar28 = (uVar30 + uVar31 & uVar5) * 0x30;
        if ((*(long *)(lVar6 + lVar28) == lVar22) &&
           (*(uint *)(lVar6 + 8 + lVar28) == *(uint *)(this + 8))) {
          if (pcVar4 != (ctrl_t *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_68,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                       ,0x5e);
            absl::lts_20240722::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                      (local_68,0x2b,"Multiple extension registrations for type \"");
            MessageLite::GetTypeName_abi_cxx11_(&local_50,*(MessageLite **)this);
            uVar21 = absl::lts_20240722::log_internal::LogMessage::operator<<
                               ((LogMessage *)local_68,(string *)&local_50);
            absl::lts_20240722::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                      (uVar21,0x10,"\", field number ");
            local_54 = *(undefined4 *)(this + 8);
            this_01 = (LogMessage *)
                      _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                                (uVar21);
            absl::lts_20240722::log_internal::LogMessage::operator<<(this_01,(char (*) [2])0x1873b9)
            ;
            std::__cxx11::string::~string((string *)&local_50);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
          }
          goto LAB_001382be;
        }
        uVar27 = (ushort)(uVar24 - 1) & (ushort)uVar24;
        uVar24 = CONCAT22((short)(uVar24 - 1 >> 0x10),uVar27);
      }
      auVar33[0] = -(*pcVar1 == kEmpty);
      auVar33[1] = -(pcVar1[1] == kEmpty);
      auVar33[2] = -(pcVar1[2] == kEmpty);
      auVar33[3] = -(pcVar1[3] == kEmpty);
      auVar33[4] = -(pcVar1[4] == kEmpty);
      auVar33[5] = -(pcVar1[5] == kEmpty);
      auVar33[6] = -(pcVar1[6] == kEmpty);
      auVar33[7] = -(pcVar1[7] == kEmpty);
      auVar33[8] = -(pcVar1[8] == kEmpty);
      auVar33[9] = -(pcVar1[9] == kEmpty);
      auVar33[10] = -(pcVar1[10] == kEmpty);
      auVar33[0xb] = -(pcVar1[0xb] == kEmpty);
      auVar33[0xc] = -(pcVar1[0xc] == kEmpty);
      auVar33[0xd] = -(pcVar1[0xd] == kEmpty);
      auVar33[0xe] = -(pcVar1[0xe] == kEmpty);
      auVar33[0xf] = -(pcVar1[0xf] == kEmpty);
      uVar27 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
      if (uVar27 != 0) break;
      uVar31 = uVar31 + uVar29 + 0x10;
      uVar29 = uVar29 + 0x10;
      if (uVar5 < uVar29) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                     );
      }
    }
    cVar18 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                       (uVar5,(ulong)pEVar26,pcVar4);
    if (cVar18 == '\0') {
      uVar24 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
    }
    else {
      uVar8 = 0xf;
      if (uVar27 != 0) {
        for (; uVar27 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar24 = (ushort)((uVar8 ^ 0xfff0) + 0x11) - 1;
    }
    FVar42.offset = uVar24 + uVar31 & uVar5;
    FVar42.probe_length = uVar29;
    lVar22 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                       ((CommonFields *)this_00,(ulong)pEVar26,FVar42,
                        (PolicyFunctions *)
                        absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
                        ::GetPolicyFunctions()::value);
    pcVar4 = (this_00->
             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.control;
    if (pcVar4 == (ctrl_t *)0x0) {
LAB_001382be:
      __assert_fail("ctrl != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x9c4,
                    "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                   );
    }
    lVar6 = *(long *)((long)&(this_00->
                             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                             ).settings_.
                             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_ + 8);
    lVar28 = lVar22 * 0x30;
    uVar21 = *(undefined8 *)this;
    uVar14 = *(undefined8 *)(this + 8);
    uVar15 = *(undefined8 *)(this + 0x10);
    uVar16 = *(undefined8 *)(this + 0x18);
    uVar17 = *(undefined8 *)(this + 0x28);
    puVar3 = (undefined8 *)(lVar6 + 0x20 + lVar28);
    *puVar3 = *(undefined8 *)(this + 0x20);
    puVar3[1] = uVar17;
    puVar3 = (undefined8 *)(lVar6 + 0x10 + lVar28);
    *puVar3 = uVar15;
    puVar3[1] = uVar16;
    *(undefined8 *)(lVar6 + lVar28) = uVar21;
    ((undefined8 *)(lVar6 + lVar28))[1] = uVar14;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::iterator::operator*((iterator *)(pcVar4 + lVar22));
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertHashEqConsistent<google::protobuf::internal::ExtensionInfo>
              (&this_00->
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ,pEVar26);
    pcVar4 = (this_00->
             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.control;
    uVar5 = (this_00->
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            ).settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    if ((uVar5 + 1 & uVar5) == 0) {
      pcVar1 = *(ctrl_t **)(lVar6 + lVar28);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (ctrl_t *)
           ((long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + (long)pcVar1);
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           pcVar1 + (SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),0) ^
                    SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),8));
      uVar24 = *(uint *)(lVar6 + 8 + lVar28);
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0) ^
           SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)uVar24;
      uVar31 = SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),0);
      uVar29 = uVar31 >> 7 ^ (ulong)pcVar4 >> 0xc;
      uVar23 = (undefined1)uVar31;
      auVar32 = ZEXT216(CONCAT11(uVar23,uVar23) & 0x7f7f);
      auVar32 = pshuflw(auVar32,auVar32,0);
      b = *(const_iterator **)
           ((long)&(this_00->
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                   ).settings_.
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_ + 8);
      uVar31 = 0;
      do {
        uVar29 = uVar29 & uVar5;
        pcVar2 = pcVar4 + uVar29;
        cVar35 = pcVar2[0xf];
        cVar36 = auVar32[0];
        auVar38[0] = -(cVar36 == *pcVar2);
        cVar39 = auVar32[1];
        auVar38[1] = -(cVar39 == pcVar2[1]);
        cVar40 = auVar32[2];
        auVar38[2] = -(cVar40 == pcVar2[2]);
        cVar41 = auVar32[3];
        auVar38[3] = -(cVar41 == pcVar2[3]);
        auVar38[4] = -(cVar36 == pcVar2[4]);
        auVar38[5] = -(cVar39 == pcVar2[5]);
        auVar38[6] = -(cVar40 == pcVar2[6]);
        auVar38[7] = -(cVar41 == pcVar2[7]);
        auVar38[8] = -(cVar36 == pcVar2[8]);
        auVar38[9] = -(cVar39 == pcVar2[9]);
        auVar38[10] = -(cVar40 == pcVar2[10]);
        auVar38[0xb] = -(cVar41 == pcVar2[0xb]);
        auVar38[0xc] = -(cVar36 == pcVar2[0xc]);
        auVar38[0xd] = -(cVar39 == pcVar2[0xd]);
        auVar38[0xe] = -(cVar40 == pcVar2[0xe]);
        auVar38[0xf] = -(cVar41 == cVar35);
        uVar27 = (ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe | (ushort)(auVar38[0xf] >> 7) << 0xf
        ;
        uVar30 = (uint)uVar27;
        while (uVar27 != 0) {
          uVar7 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar25 = uVar7 + uVar29 & uVar5;
          if ((b[uVar25 * 3].inner_.ctrl_ == pcVar1) &&
             (*(uint *)&b[uVar25 * 3].inner_.field_1 == uVar24)) {
            if (pcVar4 == (ctrl_t *)0x0) goto LAB_001382be;
            b = b + uVar25 * 3;
            a = (const_iterator *)(pcVar4 + uVar25);
            goto LAB_0013829f;
          }
          uVar27 = (ushort)(uVar30 - 1) & (ushort)uVar30;
          uVar30 = CONCAT22((short)(uVar30 - 1 >> 0x10),uVar27);
        }
        auVar34[0] = -(*pcVar2 == kEmpty);
        auVar34[1] = -(pcVar2[1] == kEmpty);
        auVar34[2] = -(pcVar2[2] == kEmpty);
        auVar34[3] = -(pcVar2[3] == kEmpty);
        auVar34[4] = -(pcVar2[4] == kEmpty);
        auVar34[5] = -(pcVar2[5] == kEmpty);
        auVar34[6] = -(pcVar2[6] == kEmpty);
        auVar34[7] = -(pcVar2[7] == kEmpty);
        auVar34[8] = -(pcVar2[8] == kEmpty);
        auVar34[9] = -(pcVar2[9] == kEmpty);
        auVar34[10] = -(pcVar2[10] == kEmpty);
        auVar34[0xb] = -(pcVar2[0xb] == kEmpty);
        auVar34[0xc] = -(pcVar2[0xc] == kEmpty);
        auVar34[0xd] = -(pcVar2[0xd] == kEmpty);
        auVar34[0xe] = -(pcVar2[0xe] == kEmpty);
        auVar34[0xf] = -(cVar35 == kEmpty);
        if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar35 == kEmpty)
        {
          a = (const_iterator *)0x0;
LAB_0013829f:
          bVar19 = absl::lts_20240722::container_internal::operator==(a,b);
          if (bVar19) {
            return;
          }
          __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf3f,
                        "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, Args = <const google::protobuf::internal::ExtensionInfo &>]"
                       );
        }
        uVar29 = uVar29 + uVar31 + 0x10;
        uVar31 = uVar31 + 0x10;
        if (uVar5 < uVar31) {
          __assert_fail("seq.index() <= capacity() && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xdbd,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                       );
        }
      } while( true );
    }
  }
  __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x145,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!local_static_registry->insert(info).second) {
    ABSL_LOG(FATAL) << "Multiple extension registrations for type \""
                    << info.message->GetTypeName() << "\", field number "
                    << info.number << ".";
  }
}